

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O3

ssize_t __thiscall cppwinrt::writer::write(writer *this,int __fd,void *__buf,size_t __n)

{
  ushort uVar1;
  size_t __n_00;
  uint uVar2;
  category cVar3;
  int iVar4;
  table_base *__n_01;
  table_base *ptVar5;
  database *extraout_RAX;
  database *extraout_RAX_00;
  database *extraout_RAX_01;
  database *extraout_RAX_02;
  database *extraout_RAX_03;
  database *extraout_RAX_04;
  char *pcVar6;
  coded_index<winmd::reader::TypeOrMethodDef> *value;
  database *pdVar7;
  char *pcVar8;
  void *__buf_00;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_00;
  size_t sVar9;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_01;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_02;
  basic_string_view<char,_std::char_traits<char>_> *first;
  undefined4 in_register_00000034;
  row_base<winmd::reader::TypeDef> *this_00;
  pointer pcVar10;
  undefined1 *puVar11;
  vector<char,std::allocator<char>> *pvVar12;
  writer *pwVar13;
  size_type __rlen;
  size_type __rlen_4;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  string_view ns;
  size_type __rlen_1;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> generics;
  string_view local_168;
  writer *local_158;
  string_view local_150;
  size_t local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [40];
  database *local_100;
  _Variant_storage<false,_winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
  local_f0;
  pointer local_a8;
  pointer local_98;
  undefined1 local_90 [32];
  pair<winmd::reader::Field,_winmd::reader::Field> local_70;
  undefined1 local_50 [16];
  anon_class_16_2_560cd874 local_40;
  
  this_00 = (row_base<winmd::reader::TypeDef> *)CONCAT44(in_register_00000034,__fd);
  local_158 = this;
  add_depends(this,(TypeDef *)this_00);
  pdVar7 = this_00->m_table->m_database;
  uVar2 = winmd::reader::table_base::get_value<unsigned_int>(this_00->m_table,this_00->m_index,2);
  local_150 = winmd::reader::database::get_string(pdVar7,uVar2);
  pcVar6 = local_150._M_str;
  local_140 = local_150._M_len;
  pdVar7 = this_00->m_table->m_database;
  uVar2 = winmd::reader::table_base::get_value<unsigned_int>(this_00->m_table,this_00->m_index,1);
  local_168 = winmd::reader::database::get_string(pdVar7,uVar2);
  pdVar7 = (database *)local_168._M_str;
  __n_01 = (table_base *)local_168._M_len;
  local_138._0_8_ = this_00->m_table;
  local_138._8_4_ = this_00->m_index * 2 + 2;
  value = (coded_index<winmd::reader::TypeOrMethodDef> *)(ulong)(uint)local_138._8_4_;
  winmd::reader::
  equal_range<winmd::reader::table<winmd::reader::GenericParam>,winmd::reader::coded_index<winmd::reader::TypeOrMethodDef>>
            ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&local_70,
             (reader *)
             &((((database *)local_138._0_8_)->TypeRef).super_table_base.m_database)->GenericParam,
             (table<winmd::reader::GenericParam> *)local_138,value);
  pwVar13 = local_158;
  if ((local_70.first.super_row_base<winmd::reader::Field>.m_table !=
       local_70.second.super_row_base<winmd::reader::Field>.m_table) ||
     (local_70.first.super_row_base<winmd::reader::Field>.m_index !=
      local_70.second.super_row_base<winmd::reader::Field>.m_index)) {
    local_138._0_8_ = (database *)0xe;
    local_138._8_8_ = "winrt::@::%<%>";
    ptVar5 = __n_01;
    if (__n_01 == (table_base *)0x0) {
LAB_00149174:
      local_90._0_8_ = (table_base *)0xffffffffffffffff;
    }
    else {
      do {
        local_90._0_8_ = &ptVar5[-1].field_0x27;
        if (ptVar5 == (table_base *)0x0) goto LAB_00149174;
        pcVar6 = (undefined1 *)((long)&pdVar7[-1].m_cache + 7) + (long)ptVar5;
        ptVar5 = (table_base *)local_90._0_8_;
      } while (*pcVar6 != '`');
    }
    if (__n_01 < (ulong)local_90._0_8_) {
      local_90._0_8_ = __n_01;
    }
    local_40.delimiter = (string_view *)local_50;
    local_50._0_4_ = 2;
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    local_50._8_8_ = ", ";
    local_90._8_8_ = pdVar7;
    local_40.list = &local_70;
    writer_base<cppwinrt::writer>::
    write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,cppwinrt::bind_list<std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>>(std::basic_string_view<char,std::char_traits<char>>const&,std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>const&)::_lambda(auto:1&)_1_>
              (&local_158->super_writer_base<cppwinrt::writer>,(string_view *)local_138,&local_150,
               (basic_string_view<char,_std::char_traits<char>_> *)local_90,&local_40);
    return (ssize_t)extraout_RAX;
  }
  if (__n_01 == (table_base *)0x7) {
    uVar2 = *(uint *)((long)&(pdVar7->TypeRef).super_table_base.m_database + 3) ^ 0x746c7573 |
            *(uint *)&(pdVar7->TypeRef).super_table_base.m_database ^ 0x73655248;
    value = (coded_index<winmd::reader::TypeOrMethodDef> *)(ulong)uVar2;
    if (((uVar2 == 0) && (local_140 == 0x12)) &&
       (auVar16[0] = -(*pcVar6 == 'W'), auVar16[1] = -(pcVar6[1] == 'i'),
       auVar16[2] = -(pcVar6[2] == 'n'), auVar16[3] = -(pcVar6[3] == 'd'),
       auVar16[4] = -(pcVar6[4] == 'o'), auVar16[5] = -(pcVar6[5] == 'w'),
       auVar16[6] = -(pcVar6[6] == 's'), auVar16[7] = -(pcVar6[7] == '.'),
       auVar16[8] = -(pcVar6[8] == 'F'), auVar16[9] = -(pcVar6[9] == 'o'),
       auVar16[10] = -(pcVar6[10] == 'u'), auVar16[0xb] = -(pcVar6[0xb] == 'n'),
       auVar16[0xc] = -(pcVar6[0xc] == 'd'), auVar16[0xd] = -(pcVar6[0xd] == 'a'),
       auVar16[0xe] = -(pcVar6[0xe] == 't'), auVar16[0xf] = -(pcVar6[0xf] == 'i'),
       auVar21[0] = -((char)*(undefined2 *)(pcVar6 + 0x10) == 'o'),
       auVar21[1] = -((char)((ushort)*(undefined2 *)(pcVar6 + 0x10) >> 8) == 'n'), auVar21[2] = 0xff
       , auVar21[3] = 0xff, auVar21[4] = 0xff, auVar21[5] = 0xff, auVar21[6] = 0xff,
       auVar21[7] = 0xff, auVar21[8] = 0xff, auVar21[9] = 0xff, auVar21[10] = 0xff,
       auVar21[0xb] = 0xff, auVar21[0xc] = 0xff, auVar21[0xd] = 0xff, auVar21[0xe] = 0xff,
       auVar21[0xf] = 0xff, auVar21 = auVar21 & auVar16,
       (ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff)) {
      pcVar10 = (local_158->super_writer_base<cppwinrt::writer>).m_first.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_finish;
      pcVar8 = "winrt::hresult";
      pcVar6 = "";
      goto LAB_00149484;
    }
  }
  else if (((__n_01 == (table_base *)0x16) &&
           (auVar19[0] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_database + 6) ==
                          'e'),
           auVar19[1] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_database + 7) == 'g'
                         ),
           auVar19[2] = -(*(char *)&(pdVar7->TypeRef).super_table_base.m_data == 'i'),
           auVar19[3] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_data + 1) == 's'),
           auVar19[4] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_data + 2) == 't'),
           auVar19[5] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_data + 3) == 'r'),
           auVar19[6] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_data + 4) == 'a'),
           auVar19[7] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_data + 5) == 't'),
           auVar19[8] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_data + 6) == 'i'),
           auVar19[9] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_data + 7) == 'o'),
           auVar19[10] = -((char)(pdVar7->TypeRef).super_table_base.m_row_count == 'n'),
           auVar19[0xb] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_row_count + 1) ==
                           'T'),
           auVar19[0xc] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_row_count + 2) ==
                           'o'),
           auVar19[0xd] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_row_count + 3) ==
                           'k'),
           auVar19[0xe] = -((pdVar7->TypeRef).super_table_base.m_row_size == 'e'),
           auVar19[0xf] = -((pdVar7->TypeRef).super_table_base.m_columns._M_elems[0].offset == 'n'),
           auVar14[0] = -(*(char *)&(pdVar7->TypeRef).super_table_base.m_database == 'E'),
           auVar14[1] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_database + 1) == 'v'
                         ),
           auVar14[2] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_database + 2) == 'e'
                         ),
           auVar14[3] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_database + 3) == 'n'
                         ),
           auVar14[4] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_database + 4) == 't'
                         ),
           auVar14[5] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_database + 5) == 'R'
                         ),
           auVar14[6] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_database + 6) == 'e'
                         ),
           auVar14[7] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_database + 7) == 'g'
                         ),
           auVar14[8] = -(*(char *)&(pdVar7->TypeRef).super_table_base.m_data == 'i'),
           auVar14[9] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_data + 1) == 's'),
           auVar14[10] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_data + 2) == 't'),
           auVar14[0xb] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_data + 3) == 'r'),
           auVar14[0xc] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_data + 4) == 'a'),
           auVar14[0xd] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_data + 5) == 't'),
           auVar14[0xe] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_data + 6) == 'i'),
           auVar14[0xf] = -(*(char *)((long)&(pdVar7->TypeRef).super_table_base.m_data + 7) == 'o'),
           auVar14 = auVar14 & auVar19,
           (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff)) &&
          ((local_140 == 0x12 &&
           (auVar15[0] = -(*pcVar6 == 'W'), auVar15[1] = -(pcVar6[1] == 'i'),
           auVar15[2] = -(pcVar6[2] == 'n'), auVar15[3] = -(pcVar6[3] == 'd'),
           auVar15[4] = -(pcVar6[4] == 'o'), auVar15[5] = -(pcVar6[5] == 'w'),
           auVar15[6] = -(pcVar6[6] == 's'), auVar15[7] = -(pcVar6[7] == '.'),
           auVar15[8] = -(pcVar6[8] == 'F'), auVar15[9] = -(pcVar6[9] == 'o'),
           auVar15[10] = -(pcVar6[10] == 'u'), auVar15[0xb] = -(pcVar6[0xb] == 'n'),
           auVar15[0xc] = -(pcVar6[0xc] == 'd'), auVar15[0xd] = -(pcVar6[0xd] == 'a'),
           auVar15[0xe] = -(pcVar6[0xe] == 't'), auVar15[0xf] = -(pcVar6[0xf] == 'i'),
           auVar20[0] = -((char)*(undefined2 *)(pcVar6 + 0x10) == 'o'),
           auVar20[1] = -((char)((ushort)*(undefined2 *)(pcVar6 + 0x10) >> 8) == 'n'),
           auVar20[2] = 0xff, auVar20[3] = 0xff, auVar20[4] = 0xff, auVar20[5] = 0xff,
           auVar20[6] = 0xff, auVar20[7] = 0xff, auVar20[8] = 0xff, auVar20[9] = 0xff,
           auVar20[10] = 0xff, auVar20[0xb] = 0xff, auVar20[0xc] = 0xff, auVar20[0xd] = 0xff,
           auVar20[0xe] = 0xff, auVar20[0xf] = 0xff, auVar20 = auVar20 & auVar15,
           (ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff)))) {
    pcVar10 = (local_158->super_writer_base<cppwinrt::writer>).m_first.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_finish;
    pcVar8 = "winrt::event_token";
    pcVar6 = "";
LAB_00149484:
    pvVar12 = (vector<char,std::allocator<char>> *)
              &(local_158->super_writer_base<cppwinrt::writer>).m_first;
    goto LAB_00149487;
  }
  if (local_158->abi_types == true) {
    cVar3 = winmd::reader::get_category((TypeDef *)this_00);
    __n_00 = local_150._M_len;
    pcVar8 = local_150._M_str;
    pcVar6 = local_168._M_str;
    if (local_150._M_len != 0x1b) goto switchD_00149445_caseD_6;
    auVar22[0] = -(local_150._M_str[0xb] == 'n');
    auVar22[1] = -(local_150._M_str[0xc] == 'd');
    auVar22[2] = -(local_150._M_str[0xd] == 'a');
    auVar22[3] = -(local_150._M_str[0xe] == 't');
    auVar22[4] = -(local_150._M_str[0xf] == 'i');
    auVar22[5] = -(local_150._M_str[0x10] == 'o');
    auVar22[6] = -(local_150._M_str[0x11] == 'n');
    auVar22[7] = -(local_150._M_str[0x12] == '.');
    auVar22[8] = -(local_150._M_str[0x13] == 'N');
    auVar22[9] = -(local_150._M_str[0x14] == 'u');
    auVar22[10] = -(local_150._M_str[0x15] == 'm');
    auVar22[0xb] = -(local_150._M_str[0x16] == 'e');
    auVar22[0xc] = -(local_150._M_str[0x17] == 'r');
    auVar22[0xd] = -(local_150._M_str[0x18] == 'i');
    auVar22[0xe] = -(local_150._M_str[0x19] == 'c');
    auVar22[0xf] = -(local_150._M_str[0x1a] == 's');
    auVar17[0] = -(*local_150._M_str == 'W');
    auVar17[1] = -(local_150._M_str[1] == 'i');
    auVar17[2] = -(local_150._M_str[2] == 'n');
    auVar17[3] = -(local_150._M_str[3] == 'd');
    auVar17[4] = -(local_150._M_str[4] == 'o');
    auVar17[5] = -(local_150._M_str[5] == 'w');
    auVar17[6] = -(local_150._M_str[6] == 's');
    auVar17[7] = -(local_150._M_str[7] == '.');
    auVar17[8] = -(local_150._M_str[8] == 'F');
    auVar17[9] = -(local_150._M_str[9] == 'o');
    auVar17[10] = -(local_150._M_str[10] == 'u');
    auVar17[0xb] = -(local_150._M_str[0xb] == 'n');
    auVar17[0xc] = -(local_150._M_str[0xc] == 'd');
    auVar17[0xd] = -(local_150._M_str[0xd] == 'a');
    auVar17[0xe] = -(local_150._M_str[0xe] == 't');
    auVar17[0xf] = -(local_150._M_str[0xf] == 'i');
    auVar17 = auVar17 & auVar22;
    uVar1 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
            (ushort)(byte)(auVar17[0xf] >> 7) << 0xf;
    value = (coded_index<winmd::reader::TypeOrMethodDef> *)(ulong)uVar1;
    if (uVar1 != 0xffff) goto switchD_00149445_caseD_6;
    value = (coded_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str;
    switch(local_168._M_len) {
    case 5:
      uVar2 = *(byte *)((long)&(((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
                               super_index_base<winmd::reader::TypeOrMethodDef>).m_table + 4) ^ 0x65
              | *(uint *)&(((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
                          super_index_base<winmd::reader::TypeOrMethodDef>).m_table ^ 0x6e616c50;
      value = (coded_index<winmd::reader::TypeOrMethodDef> *)(ulong)uVar2;
      if (uVar2 == 0) {
        local_168._M_str = "plane";
        sVar9 = 5;
        goto LAB_0014985f;
      }
      break;
    case 7:
      sVar9 = 6;
      if (*(int *)((long)&(((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
                          super_index_base<winmd::reader::TypeOrMethodDef>).m_table + 3) ==
          0x32726f74 &&
          *(int *)&(((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
                   super_index_base<winmd::reader::TypeOrMethodDef>).m_table == 0x74636556) {
        local_168._M_str = "float2";
      }
      else if (*(int *)((long)&(((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
                               super_index_base<winmd::reader::TypeOrMethodDef>).m_table + 3) ==
               0x33726f74 &&
               *(int *)&(((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
                        super_index_base<winmd::reader::TypeOrMethodDef>).m_table == 0x74636556) {
        local_168._M_str = "float3";
      }
      else {
        if (*(int *)((long)&(((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
                            super_index_base<winmd::reader::TypeOrMethodDef>).m_table + 3) !=
            0x34726f74 ||
            *(int *)&(((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
                     super_index_base<winmd::reader::TypeOrMethodDef>).m_table != 0x74636556) break;
        local_168._M_str = "float4";
      }
      goto LAB_0014985f;
    case 9:
      sVar9 = 8;
      if ((char)(((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
                super_index_base<winmd::reader::TypeOrMethodDef>).m_value == '2' &&
          (((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
          super_index_base<winmd::reader::TypeOrMethodDef>).m_table ==
          (table_base *)0x783378697274614d) {
        local_168._M_str = "float3x2";
      }
      else {
        value = (coded_index<winmd::reader::TypeOrMethodDef> *)
                ((ulong)(byte)(((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
                              super_index_base<winmd::reader::TypeOrMethodDef>).m_value ^ 0x34 |
                (ulong)(((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
                       super_index_base<winmd::reader::TypeOrMethodDef>).m_table ^
                0x783478697274614d);
        if (value != (coded_index<winmd::reader::TypeOrMethodDef> *)0x0) break;
        local_168._M_str = "float4x4";
      }
LAB_0014985f:
      local_168._M_len = sVar9;
      goto LAB_00149841;
    case 10:
      value = (coded_index<winmd::reader::TypeOrMethodDef> *)
              ((ulong)(ushort)(((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
                              super_index_base<winmd::reader::TypeOrMethodDef>).m_value ^ 0x6e6f |
              (ulong)(((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
                     super_index_base<winmd::reader::TypeOrMethodDef>).m_table ^ 0x696e726574617551)
      ;
      if (value == (coded_index<winmd::reader::TypeOrMethodDef> *)0x0) {
        local_168._M_str = "quaternion";
        sVar9 = 10;
        goto LAB_0014985f;
      }
    }
switchD_00149445_caseD_6:
    if (cVar3 == enum_type) {
      winmd::reader::row_base<winmd::reader::TypeDef>::get_list<winmd::reader::Field>
                ((pair<winmd::reader::Field,_winmd::reader::Field> *)local_90,this_00,4);
      winmd::reader::Field::Signature((FieldSig *)local_138,(Field *)local_90);
      write(local_158,(int)local_128 + 0x10,__buf_00,(size_t)value);
      if (local_a8 != (pointer)0x0) {
        operator_delete(local_a8,(long)local_98 - (long)local_a8);
      }
      std::__detail::__variant::
      _Variant_storage<false,_winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
      ::~_Variant_storage(&local_f0);
      pdVar7 = extraout_RAX_00;
      if ((pointer)local_128._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_128._24_8_,(long)local_100 - local_128._24_8_);
        pdVar7 = extraout_RAX_01;
      }
      if ((database *)local_138._8_8_ == (database *)0x0) {
        return (ssize_t)pdVar7;
      }
      puVar11 = (undefined1 *)(local_128._8_8_ - local_138._8_8_);
      pdVar7 = (database *)local_138._8_8_;
      goto LAB_001497ad;
    }
    if (cVar3 != struct_type) {
      pcVar10 = (local_158->super_writer_base<cppwinrt::writer>).m_first.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_finish;
      pvVar12 = (vector<char,std::allocator<char>> *)
                &(local_158->super_writer_base<cppwinrt::writer>).m_first;
      pcVar8 = "void*";
      pcVar6 = "";
      goto LAB_00149487;
    }
    if ((basic_string_view<char,_std::char_traits<char>_> *)local_168._M_len ==
        (basic_string_view<char,_std::char_traits<char>_> *)0x4) {
      iVar4 = bcmp(local_168._M_str,"Size",4);
      if (iVar4 == 0) {
        first = extraout_RDX_00;
        if (__n_00 == 0x12) {
LAB_001496ac:
          iVar4 = bcmp(pcVar8,"Windows.Foundation",__n_00);
          first = extraout_RDX_01;
          pwVar13 = local_158;
          if (iVar4 == 0) goto LAB_00149841;
        }
      }
      else {
        first = extraout_RDX_00;
        if ((__n_00 == 0x12) &&
           (first = extraout_RDX_00,
           *(int *)&(((typed_index<winmd::reader::TypeOrMethodDef> *)pcVar6)->
                    super_index_base<winmd::reader::TypeOrMethodDef>).m_table == 0x74636552))
        goto LAB_001496ac;
      }
    }
    else if ((basic_string_view<char,_std::char_traits<char>_> *)local_168._M_len ==
             (basic_string_view<char,_std::char_traits<char>_> *)0x5) {
      iVar4 = bcmp(local_168._M_str,"Point",5);
      first = extraout_RDX;
      if (iVar4 == 0 && __n_00 == 0x12) goto LAB_001496ac;
    }
    else {
      first = (basic_string_view<char,_std::char_traits<char>_> *)local_168._M_len;
      if ((basic_string_view<char,_std::char_traits<char>_> *)local_168._M_len ==
          (basic_string_view<char,_std::char_traits<char>_> *)0x8) {
        if ((((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
            super_index_base<winmd::reader::TypeOrMethodDef>).m_table ==
            (table_base *)0x656d695465746144) {
          if (local_150._M_len == 0x12) goto LAB_001496f1;
        }
        else if ((local_150._M_len == 0x12) &&
                ((((typed_index<winmd::reader::TypeOrMethodDef> *)local_168._M_str)->
                 super_index_base<winmd::reader::TypeOrMethodDef>).m_table ==
                 (table_base *)0x6e617053656d6954)) {
LAB_001496f1:
          iVar4 = bcmp(local_150._M_str,"Windows.Foundation",local_150._M_len);
          first = extraout_RDX_02;
          if (iVar4 == 0) {
            pcVar10 = (local_158->super_writer_base<cppwinrt::writer>).m_first.
                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pvVar12 = (vector<char,std::allocator<char>> *)
                      &(local_158->super_writer_base<cppwinrt::writer>).m_first;
            pcVar8 = "int64_t";
            pcVar6 = "";
LAB_00149487:
            std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                      (pvVar12,pcVar10,pcVar8,pcVar6);
            return (ssize_t)extraout_RAX_02;
          }
        }
      }
    }
    pwVar13 = local_158;
    if (local_158->delegate_types == true) {
      local_90._0_8_ = (table_base *)0x17;
      local_90._8_8_ = "struct impl::struct_%_%";
      get_impl_name<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)local_138,(cppwinrt *)&local_150,first);
      writer_base<cppwinrt::writer>::
      write_segment<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                (&pwVar13->super_writer_base<cppwinrt::writer>,(string_view *)local_90,
                 (string *)local_138,&local_168);
    }
    else {
      local_90._0_8_ = (table_base *)0x11;
      local_90._8_8_ = "struct struct_%_%";
      get_impl_name<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)local_138,(cppwinrt *)&local_150,first);
      writer_base<cppwinrt::writer>::
      write_segment<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                (&pwVar13->super_writer_base<cppwinrt::writer>,(string_view *)local_90,
                 (string *)local_138,&local_168);
    }
    if ((database *)local_138._0_8_ == (database *)local_128) {
      return (ssize_t)(database *)local_128;
    }
    puVar11 = (undefined1 *)(local_128._0_8_ + 1);
    pdVar7 = (database *)local_138._0_8_;
LAB_001497ad:
    operator_delete(pdVar7,(ulong)puVar11);
    return (ssize_t)extraout_RAX_03;
  }
  if ((local_140 != 0x1b) ||
     (auVar23[0] = -(pcVar6[0xb] == 'n'), auVar23[1] = -(pcVar6[0xc] == 'd'),
     auVar23[2] = -(pcVar6[0xd] == 'a'), auVar23[3] = -(pcVar6[0xe] == 't'),
     auVar23[4] = -(pcVar6[0xf] == 'i'), auVar23[5] = -(pcVar6[0x10] == 'o'),
     auVar23[6] = -(pcVar6[0x11] == 'n'), auVar23[7] = -(pcVar6[0x12] == '.'),
     auVar23[8] = -(pcVar6[0x13] == 'N'), auVar23[9] = -(pcVar6[0x14] == 'u'),
     auVar23[10] = -(pcVar6[0x15] == 'm'), auVar23[0xb] = -(pcVar6[0x16] == 'e'),
     auVar23[0xc] = -(pcVar6[0x17] == 'r'), auVar23[0xd] = -(pcVar6[0x18] == 'i'),
     auVar23[0xe] = -(pcVar6[0x19] == 'c'), auVar23[0xf] = -(pcVar6[0x1a] == 's'),
     auVar18[0] = -(*pcVar6 == 'W'), auVar18[1] = -(pcVar6[1] == 'i'),
     auVar18[2] = -(pcVar6[2] == 'n'), auVar18[3] = -(pcVar6[3] == 'd'),
     auVar18[4] = -(pcVar6[4] == 'o'), auVar18[5] = -(pcVar6[5] == 'w'),
     auVar18[6] = -(pcVar6[6] == 's'), auVar18[7] = -(pcVar6[7] == '.'),
     auVar18[8] = -(pcVar6[8] == 'F'), auVar18[9] = -(pcVar6[9] == 'o'),
     auVar18[10] = -(pcVar6[10] == 'u'), auVar18[0xb] = -(pcVar6[0xb] == 'n'),
     auVar18[0xc] = -(pcVar6[0xc] == 'd'), auVar18[0xd] = -(pcVar6[0xd] == 'a'),
     auVar18[0xe] = -(pcVar6[0xe] == 't'), auVar18[0xf] = -(pcVar6[0xf] == 'i'),
     auVar18 = auVar18 & auVar23,
     (ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff)) goto switchD_00149344_caseD_6;
  switch(__n_01) {
  case (table_base *)0x5:
    iVar4 = bcmp(pdVar7,"Plane",(size_t)__n_01);
    if (iVar4 == 0) {
      local_168._M_len = 5;
      local_168._M_str = "plane";
      goto LAB_0014981a;
    }
    break;
  case (table_base *)0x7:
    iVar4 = bcmp(pdVar7,"Vector2",(size_t)__n_01);
    if (iVar4 == 0) {
      local_168._M_len = 6;
      local_168._M_str = "float2";
    }
    else if (*(int *)((long)&(pdVar7->TypeRef).super_table_base.m_database + 3) == 0x33726f74 &&
             *(int *)&(pdVar7->TypeRef).super_table_base.m_database == 0x74636556) {
      local_168._M_len = 6;
      local_168._M_str = "float3";
    }
    else {
      if (*(int *)((long)&(pdVar7->TypeRef).super_table_base.m_database + 3) != 0x34726f74 ||
          *(int *)&(pdVar7->TypeRef).super_table_base.m_database != 0x74636556) break;
      local_168._M_len = 6;
      local_168._M_str = "float4";
    }
    goto LAB_0014981a;
  case (table_base *)0x9:
    if (*(char *)&(pdVar7->TypeRef).super_table_base.m_data == '2' &&
        (pdVar7->TypeRef).super_table_base.m_database == (database *)0x783378697274614d) {
      local_168._M_len = 8;
      local_168._M_str = "float3x2";
    }
    else {
      if (*(char *)&(pdVar7->TypeRef).super_table_base.m_data != '4' ||
          (pdVar7->TypeRef).super_table_base.m_database != (database *)0x783478697274614d) break;
      local_168._M_len = 8;
      local_168._M_str = "float4x4";
    }
LAB_0014981a:
    break;
  case (table_base *)0xa:
    iVar4 = bcmp(pdVar7,"Quaternion",(size_t)__n_01);
    if (iVar4 == 0) {
      local_168._M_len = 10;
      local_168._M_str = "quaternion";
      goto LAB_0014981a;
    }
  }
switchD_00149344_caseD_6:
LAB_00149841:
  local_138._8_8_ = "winrt::@::%";
  local_138._0_8_ = (database *)0xb;
  writer_base<cppwinrt::writer>::
  write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&pwVar13->super_writer_base<cppwinrt::writer>,(string_view *)local_138,&local_150,
             &local_168);
  return (ssize_t)extraout_RAX_04;
}

Assistant:

void write(TypeDef const& type)
        {
            add_depends(type);
            auto ns = type.TypeNamespace();
            auto name = type.TypeName();
            auto generics = type.GenericParam();

            if (!empty(generics))
            {
                write("winrt::@::%<%>", ns, remove_tick(name), bind_list(", ", generics));
                return;
            }

            if (name == "EventRegistrationToken" && ns == "Windows.Foundation")
            {
                write("winrt::event_token");
            }
            else if (name == "HResult" && ns == "Windows.Foundation")
            {
                write("winrt::hresult");
            }
            else if (abi_types)
            {
                auto category = get_category(type);

                if (ns == "Windows.Foundation.Numerics" && transform_special_numeric_type(name))
                {
                    write("winrt::@::%", ns, name);
                }
                else if (category == category::struct_type)
                {
                    if ((name == "DateTime" || name == "TimeSpan") && ns == "Windows.Foundation")
                    {
                        write("int64_t");
                    }
                    else if ((name == "Point" || name == "Size" || name == "Rect") && ns == "Windows.Foundation")
                    {
                        write("winrt::@::%", ns, name);
                    }
                    else if (delegate_types)
                    {
                        write("struct impl::struct_%_%", get_impl_name(ns), name);
                    }
                    else
                    {
                        write("struct struct_%_%", get_impl_name(ns), name);
                    }
                }
                else if (category == category::enum_type)
                {
                    write(type.FieldList().first.Signature().Type());
                }
                else
                {
                    write("void*");
                }
            }
            else
            {
                if (ns == "Windows.Foundation.Numerics")
                {
                    if (name == "Matrix3x2") { name = "float3x2"; }
                    else if (name == "Matrix4x4") { name = "float4x4"; }
                    else if (name == "Plane") { name = "plane"; }
                    else if (name == "Quaternion") { name = "quaternion"; }
                    else if (name == "Vector2") { name = "float2"; }
                    else if (name == "Vector3") { name = "float3"; }
                    else if (name == "Vector4") { name = "float4"; }

                    write("winrt::@::%", ns, name);
                }
                else
                {
                    write("winrt::@::%", ns, name);
                }
            }
        }